

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_InvalidMaximumEditionError_Test
::~CommandLineInterfaceTest_InvalidMaximumEditionError_Test
          (CommandLineInterfaceTest_InvalidMaximumEditionError_Test *this)

{
  CommandLineInterfaceTest_InvalidMaximumEditionError_Test *this_local;
  
  CommandLineInterfaceTest::~CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, InvalidMaximumEditionError) {
  CreateTempFile("foo.proto", R"schema(edition = "2023";)schema");

  mock_generator_->set_maximum_edition(EDITION_99999_TEST_ONLY);

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "generator --test_out specifies a maximum edition 99999_TEST_ONLY which "
      "is not the protoc maximum 2023");
}